

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer>
             *this,char **it)

{
  int iVar1;
  size_t __n;
  size_t __n_00;
  bool bVar2;
  char *digits;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  size_t __len;
  ptrdiff_t _Num;
  
  __n = *(size_t *)(this + 0x10);
  pcVar4 = *it;
  pcVar3 = pcVar4;
  if (__n != 0) {
    memmove(pcVar4,*(void **)(this + 8),__n);
    pcVar3 = pcVar4 + __n;
    *it = pcVar3;
  }
  __n_00 = *(size_t *)(this + 0x20);
  pcVar6 = pcVar3;
  if (__n_00 != 0) {
    pcVar6 = pcVar3 + __n_00;
    memset(pcVar3,*(int *)(this + 0x18),__n_00);
  }
  *it = pcVar6;
  iVar1 = *(int *)(this + 0x30);
  pcVar3 = "0123456789ABCDEF";
  if (*(char *)(*(long *)(*(long *)(this + 0x28) + 8) + 0x11) == 'x') {
    pcVar3 = "0123456789abcdef";
  }
  pcVar4 = pcVar4 + __n_00 + __n + (long)iVar1;
  uVar5 = *(ulong *)(*(long *)(this + 0x28) + 0x10);
  do {
    pcVar4 = pcVar4 + -1;
    *pcVar4 = pcVar3[(uint)uVar5 & 0xf];
    bVar2 = 0xf < uVar5;
    uVar5 = uVar5 >> 4;
  } while (bVar2);
  *it = pcVar6 + iVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }